

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O2

void plt_set_offsets(plt_offset *offset,size_t nb_off,undefined1 *newval)

{
  undefined1 **ppuVar1;
  void *addr;
  undefined1 **ppuVar2;
  bool bVar3;
  
  ppuVar2 = &offset->oldval;
  while (bVar3 = nb_off != 0, nb_off = nb_off - 1, bVar3) {
    ppuVar1 = ((plt_offset *)(ppuVar2 + -1))->offset;
    if (*ppuVar2 == (undefined1 *)0x0) {
      *ppuVar2 = *ppuVar1;
    }
    addr = (void *)((ulong)ppuVar1 & 0xfffffffffffff000);
    mmk_mprotect(addr,0x1000,7);
    __clear_cache(addr,(long)addr + 0x1000);
    *((plt_offset *)(ppuVar2 + -1))->offset = newval;
    ppuVar2 = ppuVar2 + 2;
  }
  return;
}

Assistant:

void plt_set_offsets(plt_offset *offset, size_t nb_off, plt_fn *newval)
{
    for (size_t i = 0; i < nb_off; ++i) {
        if (!offset[i].oldval)
            offset[i].oldval = *offset[i].offset;
        void *page_start = (void *)align2_down((uintptr_t)offset[i].offset, 4096);

        /* making a page in a rx segment rwx is usually very bad practice,
           but this is a test context, we don't have to care as much.
           Implementing this right assumes that we have a way to know
           the protection of an existing page, which is not necessarily
           available on all unices. */
        mmk_mprotect(page_start, 4096, PROT_READ|PROT_WRITE|PROT_EXEC);
# if defined __clang__  // Check for Clang first, it may set __GNUC__ too.
        __clear_cache(page_start, page_start + 4096);
# elif defined __GNUC__
        __builtin___clear_cache((char *)page_start, (char *)(page_start + 4096));
# endif
        *offset[i].offset = newval;
    }
}